

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_numpow_kx(jit_State *J)

{
  double dVar1;
  TRef TVar2;
  cTValue *tv;
  
  dVar1 = *(double *)(ulong)(J->fold).left.field_1.op12;
  if ((dVar1 == 2.0) && (!NAN(dVar1))) {
    (J->fold).ins.field_1.o = 'U';
    (J->fold).ins.field_0.op1 = (J->fold).ins.field_0.op2;
    (J->fold).ins.field_0.op2 = 0x1d3;
    TVar2 = lj_opt_fold(J);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    tv = lj_ir_k64_find(J,0x3ff0000000000000);
    TVar2 = lj_ir_k64(J,IR_KNUM,tv);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_1.o = '1';
    return 1;
  }
  return 0;
}

Assistant:

LJFOLD(POW KNUM any)
LJFOLDF(simplify_numpow_kx)
{
  lua_Number n = knumleft;
  if (n == 2.0) {  /* 2.0 ^ i ==> ldexp(1.0, tonum(i)) */
    fins->o = IR_CONV;
#if LJ_TARGET_X86ORX64
    fins->op1 = fins->op2;
    fins->op2 = IRCONV_NUM_INT;
    fins->op2 = (IRRef1)lj_opt_fold(J);
#endif
    fins->op1 = (IRRef1)lj_ir_knum_one(J);
    fins->o = IR_LDEXP;
    return RETRYFOLD;
  }
  return NEXTFOLD;
}